

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HCrash.cpp
# Opt level: O0

void __thiscall HCrash::ltssf_iterate(HCrash *this,HModel *ptr_model)

{
  reference pvVar1;
  reference pvVar2;
  double *pdVar3;
  HModel *in_RSI;
  HModel *in_RDI;
  bool bVar4;
  double extraout_XMM0_Qa;
  int pri_v;
  int vr_ty;
  int sourceOut;
  int columnOut;
  int rowOut;
  int columnIn;
  double rlv_pv_v;
  double abs_pv_v;
  bool bs_cg;
  HCrash *in_stack_00000040;
  bool ltssf_stop;
  double dVar5;
  HModel *this_00;
  HModel *pHVar6;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  double local_28;
  double dVar7;
  int sourceOut_00;
  int in_stack_ffffffffffffffe8;
  uint3 in_stack_ffffffffffffffec;
  uint columnIn_00;
  
  *(undefined4 *)&(in_RDI->timer).field_0x358 = 0;
  *(undefined4 *)&(in_RDI->timer).field_0x35c = 0;
  columnIn_00 = (uint)in_stack_ffffffffffffffec;
  do {
    ltssf_cz_r((HCrash *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (*(int *)&(in_RDI->timer).field_0x364 == -1) {
      return;
    }
    this_00 = (HModel *)in_RDI->dblOption;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&in_RDI->field_0x50,
                        (long)*(int *)&(in_RDI->timer).field_0x364);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)this_00,(long)*pvVar1);
    *(value_type *)&(in_RDI->timer).field_0x368 = *pvVar1;
    pHVar6 = in_RDI;
    ltssf_cz_c(in_stack_00000040,(HModel *)abs_pv_v);
    bVar4 = *(int *)&(pHVar6->timer).field_0x36c != -1;
    columnIn_00 = CONCAT13((char)(columnIn_00 >> 0x18),CONCAT12(bVar4,(short)columnIn_00));
    if (bVar4) {
      *(int *)&(pHVar6->timer).field_0x35c = *(int *)&(pHVar6->timer).field_0x35c + 1;
      std::abs((int)in_RDI);
      dVar5 = extraout_XMM0_Qa;
      dVar7 = extraout_XMM0_Qa;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&(pHVar6->timer).field_0x1e8,
                          (long)*(int *)&(pHVar6->timer).field_0x36c);
      sourceOut_00 = (int)((ulong)dVar7 >> 0x20);
      local_28 = dVar5 / *pvVar2;
      pdVar3 = std::min<double>((double *)&stack0xffffffffffffffe0,
                                (double *)&(pHVar6->timer).field_0x380);
      *(double *)&(pHVar6->timer).field_0x380 = *pdVar3;
      pdVar3 = std::min<double>(&local_28,(double *)&(pHVar6->timer).field_0x388);
      *(double *)&(pHVar6->timer).field_0x388 = *pdVar3;
      in_stack_ffffffffffffffd4 = *(undefined4 *)&(pHVar6->timer).field_0x36c;
      in_stack_ffffffffffffffd0 = *(undefined4 *)&(pHVar6->timer).field_0x364;
      HModel::updatePivots(in_RSI,columnIn_00,in_stack_ffffffffffffffe8,sourceOut_00);
      if (*(int *)(*(long *)pHVar6->intOption + 0x5e8) != 0) {
        HModel::updateMatrix(this_00,(int)((ulong)dVar5 >> 0x20),SUB84(dVar5,0));
      }
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&pHVar6->field_0x50,
                          (long)*(int *)&(pHVar6->timer).field_0x364);
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((pHVar6->timer).itemTicks + 0xc),
                          (long)*pvVar1);
      *pvVar1 = *pvVar1 + 1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&pHVar6->field_0x68,
                          (long)*(int *)&(pHVar6->timer).field_0x36c);
      in_stack_ffffffffffffffc4 = *pvVar1;
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((pHVar6->timer).itemTicks + 0x12),
                          (long)in_stack_ffffffffffffffc4);
      *pvVar1 = *pvVar1 + 1;
    }
    in_RDI = pHVar6;
    ltssf_u_da((HCrash *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    *(undefined4 *)&(in_RDI->timer).field_0x3a4 = 0xffffffff;
    for (in_stack_ffffffffffffffc0 = 3; 0 < in_stack_ffffffffffffffc0;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + -1) {
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)((in_RDI->timer).itemStart + 0xe),
                          (long)in_stack_ffffffffffffffc0);
      if (*pvVar1 < in_RDI->intOption[2] + 1) {
        *(int *)&(in_RDI->timer).field_0x3a4 = in_stack_ffffffffffffffc0;
        break;
      }
    }
    if ((((in_RDI->timer).field_0x341 & 1) == 0) &&
       (*(int *)&(in_RDI->timer).field_0x3a4 + *(int *)&(in_RDI->timer).field_0x3a8 < 4)) {
      printf("Max active row priority of %d + Max original col priority of %d = %d <= %d: no value in performing further LTSSF crash\n"
             ,(ulong)*(uint *)&(in_RDI->timer).field_0x3a4,
             (ulong)*(uint *)&(in_RDI->timer).field_0x3a8,
             (ulong)(uint)(*(int *)&(in_RDI->timer).field_0x3a4 +
                          *(int *)&(in_RDI->timer).field_0x3a8),3);
      columnIn_00 = CONCAT13(1,(int3)columnIn_00);
    }
    *(int *)&(in_RDI->timer).field_0x358 = *(int *)&(in_RDI->timer).field_0x358 + 1;
    if ((columnIn_00 & 0x1000000) != 0) {
      return;
    }
  } while( true );
}

Assistant:

void HCrash::ltssf_iterate(HModel *ptr_model) {
  //	LTSSF Main loop
  n_crsh_ps = 0;
  n_crsh_bs_cg = 0;
  bool ltssf_stop = false;
  for (;;) {
    //		printf("\n LTSSF Crash pass %d\n", n_crsh_ps);
    //		ltssf_rp_r_pri();
    ltssf_cz_r();
    if (cz_r_n == no_ix)
      break;
    cz_r_pri_v = crsh_r_ty_pri_v[crsh_r_ty[cz_r_n]];
    ltssf_cz_c(ptr_model);
    bool bs_cg = cz_c_n != no_ix;
    if (bs_cg) {
      if (Rp_TwoD_da)
	printf("Pass %2d; cz_r = %2d; cz_c = %2d\n", n_crsh_ps, cz_r_n,
	       cz_c_n);
      //			A basis change has occurred
      n_crsh_bs_cg += 1;
      double abs_pv_v = abs(pv_v);
      double rlv_pv_v = abs_pv_v / crsh_mtx_c_mx_abs_v[cz_c_n];
      mn_abs_pv_v = min(abs_pv_v, mn_abs_pv_v);
      mn_rlv_pv_v = min(rlv_pv_v, mn_rlv_pv_v);
      int columnIn = cz_c_n;
      int rowOut = cz_r_n;
      int columnOut = numCol + cz_r_n;
      int sourceOut = 1;
      //			Update the basic/nonbasic variable info and the row-wise copy of the matrix
      model->updatePivots(columnIn, rowOut, sourceOut);
      if (model->mlFg_haveMatrixRowWise)
	model->updateMatrix(columnIn, columnOut);
      //		    Update the count of this type of removal and addition
      int vr_ty = crsh_r_ty[cz_r_n];
      crsh_vr_ty_rm_n_r[vr_ty] += 1;
      vr_ty = crsh_c_ty[cz_c_n];
      crsh_vr_ty_add_n_c[vr_ty] += 1;
    } else {
      if (Rp_TwoD_da) printf("Pass %2d; cz_r = %2d: No basis change\n", n_crsh_ps, cz_r_n);
    }
    if (Rp_TwoD_da) ltssf_rp_pri_k_da();
    ltssf_u_da(ptr_model);
    //for (int r_n = 0; r_n < numRow; r_n++) {
    //if (crsh_act_r[r_n] != 0)
    //printf("Row %2d , Pri = %1d; K = %2d\n", r_n, crsh_r_ty_pri_v[crsh_r_ty[r_n]], crsh_r_k[r_n]);
    //}
    //Check LTSSF data every ltssf_ck_fq passes (if ltssf_ck_fq>0)
    if ((ltssf_ck_fq > 0) && (n_crsh_ps % ltssf_ck_fq == 0)) ltssf_ck_da();
    if (Rp_TwoD_da) ltssf_rp_pri_k_da();
    if (TwoD_hdr) {
      //			Determine whether the are still rows worth removing
      mx_r_pri = crsh_mn_pri_v - 1;
      for (int pri_v = crsh_mx_pri_v; pri_v > crsh_mn_pri_v; pri_v--) {
	if (crsh_r_pri_mn_r_k[pri_v] < numCol + 1) {
	  mx_r_pri = pri_v;
	  break;
	}
      }
      if ((!alw_al_bs_cg) && (mx_r_pri + mx_c_pri <= crsh_mx_pri_v)) {
	printf("Max active row priority of %d + Max original col priority of %d = %d <= %d: no value in performing further LTSSF crash\n",
	       mx_r_pri, mx_c_pri, mx_r_pri + mx_c_pri, crsh_mx_pri_v);
	ltssf_stop = true;
      }
    }
    
    n_crsh_ps += 1;
    if (ltssf_stop) break;
    //if (n_crsh_ps==6) break;
  }
}